

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_prepare.cpp
# Opt level: O2

unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true> __thiscall
duckdb::Transformer::TransformDeallocate(Transformer *this,PGDeallocateStmt *stmt)

{
  pointer pDVar1;
  pointer pDVar2;
  ParserException *this_00;
  long in_RDX;
  allocator local_39;
  string local_38;
  
  if (*(long *)(in_RDX + 8) != 0) {
    make_uniq<duckdb::DropStatement>();
    pDVar1 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
             operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                         *)this);
    pDVar2 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (&pDVar1->info);
    (pDVar2->super_ParseInfo).field_0x9 = 5;
    ::std::__cxx11::string::string((string *)&local_38,*(char **)(in_RDX + 8),&local_39);
    pDVar1 = unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>::
             operator->((unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>,_true>
                         *)this);
    pDVar2 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (&pDVar1->info);
    ::std::__cxx11::string::operator=((string *)&pDVar2->name,(string *)&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    return (unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>_>)
           (unique_ptr<duckdb::DropStatement,_std::default_delete<duckdb::DropStatement>_>)this;
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"DEALLOCATE requires a name",&local_39);
  ParserException::ParserException(this_00,&local_38);
  __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<DropStatement> Transformer::TransformDeallocate(duckdb_libpgquery::PGDeallocateStmt &stmt) {
	if (!stmt.name) {
		throw ParserException("DEALLOCATE requires a name");
	}

	auto result = make_uniq<DropStatement>();
	result->info->type = CatalogType::PREPARED_STATEMENT;
	result->info->name = string(stmt.name);
	return result;
}